

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_morph.cpp
# Opt level: O1

bool P_MorphPlayer(player_t *activator,player_t *p,PClassPlayerPawn *spawntype,int duration,
                  int style,PClassActor *enter_flash,PClassActor *exit_flash)

{
  ActorFlags *pAVar1;
  ActorFlags2 *pAVar2;
  ActorFlags3 *pAVar3;
  uint uVar4;
  APlayerPawn *this;
  PClass *pPVar5;
  undefined1 *puVar6;
  PClass *pPVar7;
  int iVar8;
  PClass *pPVar9;
  AInventory *pAVar10;
  APlayerPawn *this_00;
  AActor *pAVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  APlayerPawn *pAVar12;
  PClassPlayerPawn *pPVar13;
  PClass *pPVar14;
  AHexenArmor *hxarmor;
  AInventory *pAVar15;
  bool bVar16;
  DVector3 local_48;
  
  this = p->mo;
  if (((this != (APlayerPawn *)0x0) && (((this->super_AActor).flags3.Value & 0x200) == 0)) &&
     ((((this->super_AActor).flags2.Value & 0x8000000) == 0 ||
      ((style & 0x40U) != 0 && p == activator)))) {
    if (p->morphTics == 0) {
      if (spawntype == (PClassPlayerPawn *)0x0) {
        return false;
      }
      if (p->health < 1) {
        return false;
      }
      pPVar13 = spawntype;
      if ((PClassPlayerPawn *)APlayerPawn::RegistrationInfo.MyClass != spawntype) {
        do {
          pPVar13 = (PClassPlayerPawn *)(pPVar13->super_PClassActor).super_PClass.ParentClass;
          if (pPVar13 == (PClassPlayerPawn *)APlayerPawn::RegistrationInfo.MyClass) break;
        } while (pPVar13 != (PClassPlayerPawn *)0x0);
        if (pPVar13 == (PClassPlayerPawn *)0x0) {
          return false;
        }
      }
      if ((this->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        pPVar9 = (PClass *)
                 (*(code *)*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
        (this->super_AActor).super_DThinker.super_DObject.Class = pPVar9;
      }
      if ((PClassPlayerPawn *)(this->super_AActor).super_DThinker.super_DObject.Class != spawntype)
      {
        local_48.X = (this->super_AActor).__Pos.X;
        local_48.Y = (this->super_AActor).__Pos.Y;
        local_48.Z = (this->super_AActor).__Pos.Z;
        this_00 = (APlayerPawn *)
                  AActor::StaticSpawn(&spawntype->super_PClassActor,&local_48,NO_REPLACE,false);
        pAVar10 = (this->super_AActor).Inventory.field_0.p;
        if ((pAVar10 != (AInventory *)0x0) &&
           (((pAVar10->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
          (this->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
          pAVar10 = (AInventory *)0x0;
        }
        EndAllPowerupEffects(pAVar10);
        DObject::StaticPointerSubstitution((DObject *)this,(DObject *)this_00);
        if ((((uint)style >> 0xe & 1) != 0) &&
           (((this_00->super_AActor).flags2.Value & 0x10000) == 0)) {
          (this_00->super_AActor).Translation = (this->super_AActor).Translation;
        }
        iVar8 = (this->super_AActor).tid;
        if (((uint)style >> 8 & 1) != 0 && iVar8 != 0) {
          (this_00->super_AActor).tid = iVar8;
          AActor::AddToHash((AActor *)this_00);
          AActor::RemoveFromHash(&this->super_AActor);
          (this->super_AActor).tid = 0;
        }
        (this_00->super_AActor).Angles.Yaw.Degrees = (this->super_AActor).Angles.Yaw.Degrees;
        (this_00->super_AActor).target.field_0 = (this->super_AActor).target.field_0;
        (this_00->super_AActor).tracer.field_0 = (this->super_AActor).tracer.field_0;
        (this_00->super_AActor).alternative.field_0.p = &this->super_AActor;
        (this_00->super_AActor).FriendPlayer = (this->super_AActor).FriendPlayer;
        (this_00->super_AActor).DesignatedTeam = (this->super_AActor).DesignatedTeam;
        (this_00->super_AActor).Score = (this->super_AActor).Score;
        (p->PremorphWeapon).field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AWeapon>_1)p->ReadyWeapon
        ;
        uVar4 = (this->super_AActor).flags.Value;
        (this_00->super_AActor).special2 = uVar4 & 0xffffffbf;
        (this_00->super_AActor).player = p;
        if (((this->super_AActor).renderflags.Value & 0x8000) != 0) {
          (this_00->super_AActor).special2 = uVar4 | 0x40;
        }
        if (((p->viewheight < this_00->ViewHeight) && (p->deltaviewheight == 0.0)) &&
           (!NAN(p->deltaviewheight))) {
          p->deltaviewheight = ((p->mo->ViewHeight + p->crouchviewdelta) - p->viewheight) * 0.125;
        }
        pAVar1 = &(this_00->super_AActor).flags;
        pAVar1->Value = pAVar1->Value | uVar4 & 0x40200;
        pAVar2 = &(this_00->super_AActor).flags2;
        pAVar2->Value = pAVar2->Value | (this->super_AActor).flags2.Value & 0x10;
        pAVar3 = &(this_00->super_AActor).flags3;
        pAVar3->Value = pAVar3->Value | (this->super_AActor).flags3.Value & 8;
        if (enter_flash == (PClassActor *)0x0) {
          enter_flash = (PClassActor *)ATeleportFog::RegistrationInfo.MyClass;
        }
        local_48.Z = gameinfo.telefogheight + (this->super_AActor).__Pos.Z;
        local_48.X = (this->super_AActor).__Pos.X;
        local_48.Y = (this->super_AActor).__Pos.Y;
        pAVar11 = AActor::StaticSpawn(enter_flash,&local_48,ALLOW_REPLACE,false);
        (this->super_AActor).player = (player_t *)0x0;
        (this->super_AActor).alternative.field_0.p = (AActor *)this_00;
        (this->super_AActor).flags.Value =
             (this->super_AActor).flags.Value & 0xeffffff9 | 0x10000000;
        puVar6 = (undefined1 *)((long)&(this->super_AActor).renderflags.Value + 1);
        *puVar6 = *puVar6 | 0x80;
        iVar8 = 0x578;
        if (duration != 0) {
          iVar8 = duration;
        }
        p->morphTics = iVar8;
        p->MorphedPlayerClass = spawntype;
        p->MorphStyle = style;
        if (exit_flash == (PClassActor *)0x0) {
          exit_flash = (PClassActor *)ATeleportFog::RegistrationInfo.MyClass;
        }
        p->MorphExitFlash = exit_flash;
        p->health = (this_00->super_AActor).health;
        p->mo = this_00;
        (p->Vel).X = 0.0;
        (p->Vel).Y = 0.0;
        AActor::ObtainInventory((AActor *)this_00,&this->super_AActor);
        pAVar10 = (this_00->super_AActor).Inventory.field_0.p;
        if ((pAVar10 != (AInventory *)0x0) &&
           (((pAVar10->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
          (this_00->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
          pAVar10 = (AInventory *)0x0;
        }
        do {
          do {
            pAVar15 = pAVar10;
            if (pAVar15 == (AInventory *)0x0) {
              pAVar10 = (this_00->super_AActor).Inventory.field_0.p;
              if ((pAVar10 != (AInventory *)0x0) &&
                 (((pAVar10->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
                (this_00->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
                pAVar10 = (AInventory *)0x0;
              }
              InitAllPowerupEffects(pAVar10);
              (*(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x2a])(this_00);
              pAVar12 = (APlayerPawn *)(p->camera).field_0.p;
              if ((pAVar12 != (APlayerPawn *)0x0) &&
                 (((pAVar12->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
                (p->camera).field_0.p = (AActor *)0x0;
                pAVar12 = (APlayerPawn *)0x0;
              }
              if (pAVar12 == this) {
                (p->camera).field_0.p = (AActor *)this_00;
              }
              (this_00->ScoreIcon).texnum = (this->ScoreIcon).texnum;
              if (pAVar11 != (AActor *)0x0) {
                (pAVar11->target).field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)p->mo;
                return true;
              }
              return true;
            }
            pAVar10 = (pAVar15->super_AActor).Inventory.field_0.p;
            if ((pAVar10 != (AInventory *)0x0) &&
               (((pAVar10->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
              (pAVar15->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
              pAVar10 = (AInventory *)0x0;
            }
            pPVar9 = AArmor::RegistrationInfo.MyClass;
            if ((pAVar15->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
              iVar8 = (**(pAVar15->super_AActor).super_DThinker.super_DObject._vptr_DObject)
                                (pAVar15);
              (pAVar15->super_AActor).super_DThinker.super_DObject.Class =
                   (PClass *)CONCAT44(extraout_var,iVar8);
            }
            pPVar7 = AHexenArmor::RegistrationInfo.MyClass;
            pPVar5 = (pAVar15->super_AActor).super_DThinker.super_DObject.Class;
            bVar16 = pPVar5 != (PClass *)0x0;
            pPVar14 = pPVar5;
            if (pPVar5 != pPVar9 && bVar16) {
              do {
                pPVar14 = pPVar14->ParentClass;
                bVar16 = pPVar14 != (PClass *)0x0;
                if (pPVar14 == pPVar9) break;
              } while (pPVar14 != (PClass *)0x0);
            }
          } while (!bVar16);
          if (pPVar5 == (PClass *)0x0) {
            iVar8 = (**(pAVar15->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar15);
            (pAVar15->super_AActor).super_DThinker.super_DObject.Class =
                 (PClass *)CONCAT44(extraout_var_00,iVar8);
          }
          pPVar9 = (pAVar15->super_AActor).super_DThinker.super_DObject.Class;
          bVar16 = pPVar9 != (PClass *)0x0;
          if (pPVar9 != pPVar7 && bVar16) {
            do {
              pPVar9 = pPVar9->ParentClass;
              bVar16 = pPVar9 != (PClass *)0x0;
              if (pPVar9 == pPVar7) break;
            } while (pPVar9 != (PClass *)0x0);
          }
          if (bVar16) {
            pAVar15[1].super_AActor.super_DThinker.super_DObject.ObjNext = (DObject *)0x0;
            pAVar15[1].super_AActor.super_DThinker.super_DObject.GCNext = (DObject *)0x0;
            pAVar15[1].super_AActor.super_DThinker.super_DObject._vptr_DObject = (_func_int **)0x0;
            pAVar15[1].super_AActor.super_DThinker.super_DObject.Class = (PClass *)0x0;
            *(double *)&pAVar15[1].super_AActor.super_DThinker.super_DObject.ObjectFlags =
                 spawntype->HexenArmor[0];
          }
          else {
            (*(pAVar15->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x25])(pAVar15);
          }
        } while( true );
      }
    }
    else {
      if ((this->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        pPVar9 = (PClass *)
                 (*(code *)*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
        (this->super_AActor).super_DThinker.super_DObject.Class = pPVar9;
      }
      if (((PClassPlayerPawn *)(this->super_AActor).super_DThinker.super_DObject.Class == spawntype)
         && ((p->mo->PlayerFlags & 2) != 0)) {
        iVar8 = 0x555;
        if (duration != 0) {
          iVar8 = duration + -0x23;
        }
        if ((p->morphTics < iVar8) &&
           (pAVar10 = AActor::FindInventory
                                (&p->mo->super_AActor,
                                 (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true),
           pAVar10 == (AInventory *)0x0)) {
          AActor::GiveInventoryType
                    (&p->mo->super_AActor,
                     (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass);
        }
      }
    }
  }
  return false;
}

Assistant:

bool P_MorphPlayer (player_t *activator, player_t *p, PClassPlayerPawn *spawntype, int duration, int style, PClassActor *enter_flash, PClassActor *exit_flash)
{
	AInventory *item;
	APlayerPawn *morphed;
	APlayerPawn *actor;

	actor = p->mo;
	if (actor == nullptr)
	{
		return false;
	}
	if (actor->flags3 & MF3_DONTMORPH)
	{
		return false;
	}
	if ((p->mo->flags2 & MF2_INVULNERABLE) && ((p != activator) || (!(style & MORPH_WHENINVULNERABLE))))
	{ // Immune when invulnerable unless this is a power we activated
		return false;
	}
	if (p->morphTics)
	{ // Player is already a beast
		if ((p->mo->GetClass() == spawntype)
			&& (p->mo->PlayerFlags & PPF_CANSUPERMORPH)
			&& (p->morphTics < (((duration) ? duration : MORPHTICS) - TICRATE))
			&& (p->mo->FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true) == nullptr))
		{ // Make a super chicken
			p->mo->GiveInventoryType (RUNTIME_CLASS(APowerWeaponLevel2));
		}
		return false;
	}
	if (p->health <= 0)
	{ // Dead players cannot morph
		return false;
	}
	if (spawntype == nullptr)
	{
		return false;
	}
	if (!spawntype->IsDescendantOf (RUNTIME_CLASS(APlayerPawn)))
	{
		return false;
	}
	if (spawntype == p->mo->GetClass())
	{
		return false;
	}

	morphed = static_cast<APlayerPawn *>(Spawn (spawntype, actor->Pos(), NO_REPLACE));
	EndAllPowerupEffects(actor->Inventory);
	DObject::StaticPointerSubstitution (actor, morphed);
	if ((style & MORPH_TRANSFERTRANSLATION) && !(morphed->flags2 & MF2_DONTTRANSLATE))
	{
		morphed->Translation = actor->Translation;
	}
	if ((actor->tid != 0) && (style & MORPH_NEWTIDBEHAVIOUR))
	{
		morphed->tid = actor->tid;
		morphed->AddToHash ();
		actor->RemoveFromHash ();
		actor->tid = 0;
	}
	morphed->Angles.Yaw = actor->Angles.Yaw;
	morphed->target = actor->target;
	morphed->tracer = actor->tracer;
	morphed->alternative = actor;
	morphed->FriendPlayer = actor->FriendPlayer;
	morphed->DesignatedTeam = actor->DesignatedTeam;
	morphed->Score = actor->Score;
	p->PremorphWeapon = p->ReadyWeapon;
	morphed->special2 = actor->flags & ~MF_JUSTHIT;
	morphed->player = p;
	if (actor->renderflags & RF_INVISIBLE)
	{
		morphed->special2 |= MF_JUSTHIT;
	}
	if (morphed->ViewHeight > p->viewheight && p->deltaviewheight == 0)
	{ // If the new view height is higher than the old one, start moving toward it.
		p->deltaviewheight = p->GetDeltaViewHeight();
	}
	morphed->flags  |= actor->flags & (MF_SHADOW|MF_NOGRAVITY);
	morphed->flags2 |= actor->flags2 & MF2_FLY;
	morphed->flags3 |= actor->flags3 & MF3_GHOST;
	AActor *eflash = Spawn(((enter_flash) ? enter_flash : RUNTIME_CLASS(ATeleportFog)), actor->PosPlusZ(TELEFOGHEIGHT), ALLOW_REPLACE);
	actor->player = nullptr;
	actor->alternative = morphed;
	actor->flags &= ~(MF_SOLID|MF_SHOOTABLE);
	actor->flags |= MF_UNMORPHED;
	actor->renderflags |= RF_INVISIBLE;
	p->morphTics = (duration) ? duration : MORPHTICS;

	// [MH] Used by SBARINFO to speed up face drawing
	p->MorphedPlayerClass = spawntype;

	p->MorphStyle = style;
	p->MorphExitFlash = (exit_flash) ? exit_flash : RUNTIME_CLASS(ATeleportFog);
	p->health = morphed->health;
	p->mo = morphed;
	p->Vel.X = p->Vel.Y = 0;
	morphed->ObtainInventory (actor);
	// Remove all armor
	for (item = morphed->Inventory; item != nullptr; )
	{
		AInventory *next = item->Inventory;
		if (item->IsKindOf (RUNTIME_CLASS(AArmor)))
		{
			if (item->IsKindOf (RUNTIME_CLASS(AHexenArmor)))
			{
				// Set the HexenArmor slots to 0, except the class slot.
				AHexenArmor *hxarmor = static_cast<AHexenArmor *>(item);
				hxarmor->Slots[0] = 0;
				hxarmor->Slots[1] = 0;
				hxarmor->Slots[2] = 0;
				hxarmor->Slots[3] = 0;
				hxarmor->Slots[4] = spawntype->HexenArmor[0];
			}
			else
			{
				item->DepleteOrDestroy();
			}
		}
		item = next;
	}
	InitAllPowerupEffects(morphed->Inventory);
	morphed->ActivateMorphWeapon ();
	if (p->camera == actor)
	{
		p->camera = morphed;
	}
	morphed->ScoreIcon = actor->ScoreIcon;	// [GRB]
	if (eflash)	
		eflash->target = p->mo;
	return true;
}